

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

void Abc_TruthStoreRead(char *pFileName,Abc_TtStore_t *p)

{
  char *pcVar1;
  char *__ptr;
  long lVar2;
  long lVar3;
  
  __ptr = Abc_FileRead(pFileName);
  if (__ptr == (char *)0x0) {
    return;
  }
  lVar3 = 0;
  lVar2 = 0;
  while (lVar2 = (long)(int)lVar2, __ptr[lVar2] != '\n') {
    Abc_TruthReadHex(p->pFuncs[lVar3],__ptr + lVar2,p->nVars);
    do {
      pcVar1 = __ptr + lVar2;
      lVar2 = lVar2 + 1;
    } while (*pcVar1 != '\n');
    lVar3 = lVar3 + 1;
  }
  if ((int)lVar3 <= p->nFuncs) {
    p->nFuncs = (int)lVar3;
    free(__ptr);
    return;
  }
  __assert_fail("p->nFuncs >= nLines",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDec.c"
                ,0x156,"void Abc_TruthStoreRead(char *, Abc_TtStore_t *)");
}

Assistant:

void Abc_TruthStoreRead( char * pFileName, Abc_TtStore_t * p )
{
    char * pContents;
    int i, nLines;
    pContents = Abc_FileRead( pFileName );
    if ( pContents == NULL )
        return;
    // here it is assumed (without checking!) that each line of the file 
    // begins with a string of hexadecimal chars followed by space

    // the file will be read till the first empty line (pContents[i] == '\n')
    // (note that Abc_FileRead() added several empty lines at the end of the file contents)
    for ( nLines = i = 0; pContents[i] != '\n'; )
    {
        // read one line
        Abc_TruthReadHex( p->pFuncs[nLines++], &pContents[i], p->nVars );
        // skip till after the end-of-line symbol
        // (note that end-of-line symbol is also skipped)
        while ( pContents[i++] != '\n' );
    }
    // adjust the number of functions read 
    // (we may have allocated more storage because some lines in the file were empty)
    assert( p->nFuncs >= nLines );
    p->nFuncs = nLines;
    ABC_FREE( pContents );
}